

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_grp.cpp
# Opt level: O0

FResourceFile * CheckGRP(char *filename,FileReader *file,bool quiet)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  FResourceFile *this;
  FResourceFile *rf;
  char head [12];
  bool quiet_local;
  FileReader *file_local;
  char *filename_local;
  
  head[4] = quiet;
  unique0x100001e7 = file;
  lVar3 = FileReader::GetLength(file);
  if (0xb < lVar3) {
    (*(stack0xffffffffffffffe0->super_FileReaderBase)._vptr_FileReaderBase[4])
              (stack0xffffffffffffffe0,0,0);
    (*(stack0xffffffffffffffe0->super_FileReaderBase)._vptr_FileReaderBase[2])
              (stack0xffffffffffffffe0,(long)&rf + 3,0xc);
    (*(stack0xffffffffffffffe0->super_FileReaderBase)._vptr_FileReaderBase[4])
              (stack0xffffffffffffffe0,0,0);
    iVar1 = memcmp((void *)((long)&rf + 3),"KenSilverman",0xc);
    if (iVar1 == 0) {
      this = (FResourceFile *)operator_new(0x28);
      FGrpFile::FGrpFile((FGrpFile *)this,filename,stack0xffffffffffffffe0);
      uVar2 = (*(((FUncompressedFile *)&this->_vptr_FResourceFile)->super_FResourceFile).
                _vptr_FResourceFile[3])(this,(ulong)(byte)head[4] & 1);
      if ((uVar2 & 1) != 0) {
        return this;
      }
      *(FileReader **)&((FUncompressedFile *)&this->Reader)->super_FResourceFile = (FileReader *)0x0
      ;
      if (this != (FResourceFile *)0x0) {
        (*(((FUncompressedFile *)&this->_vptr_FResourceFile)->super_FResourceFile).
          _vptr_FResourceFile[1])();
      }
    }
  }
  return (FResourceFile *)0x0;
}

Assistant:

FResourceFile *CheckGRP(const char *filename, FileReader *file, bool quiet)
{
	char head[12];

	if (file->GetLength() >= 12)
	{
		file->Seek(0, SEEK_SET);
		file->Read(&head, 12);
		file->Seek(0, SEEK_SET);
		if (!memcmp(head, "KenSilverman", 12))
		{
			FResourceFile *rf = new FGrpFile(filename, file);
			if (rf->Open(quiet)) return rf;

			rf->Reader = NULL; // to avoid destruction of reader
			delete rf;
		}
	}
	return NULL;
}